

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bin_io_text_write.cpp
# Opt level: O2

void __thiscall
ritobin::io::text_write_impl::BinTextWriter::
write_items<std::vector<ritobin::Element,std::allocator<ritobin::Element>>>
          (BinTextWriter *this,vector<ritobin::Element,_std::allocator<ritobin::Element>_> *items)

{
  size_t *psVar1;
  pointer pEVar2;
  pointer item;
  
  if ((items->super__Vector_base<ritobin::Element,_std::allocator<ritobin::Element>_>)._M_impl.
      super__Vector_impl_data._M_start !=
      (items->super__Vector_base<ritobin::Element,_std::allocator<ritobin::Element>_>)._M_impl.
      super__Vector_impl_data._M_finish) {
    TextWriter::write_raw<3ul>(&this->writer,(char (*) [3])"{\n");
    psVar1 = &(this->writer).ident_;
    *psVar1 = *psVar1 + (this->writer).indent_size_;
    pEVar2 = (items->super__Vector_base<ritobin::Element,_std::allocator<ritobin::Element>_>).
             _M_impl.super__Vector_impl_data._M_finish;
    for (item = (items->super__Vector_base<ritobin::Element,_std::allocator<ritobin::Element>_>).
                _M_impl.super__Vector_impl_data._M_start; item != pEVar2; item = item + 1) {
      write_item(this,item);
    }
    psVar1 = &(this->writer).ident_;
    *psVar1 = *psVar1 - (this->writer).indent_size_;
    TextWriter::pad(&this->writer);
    TextWriter::write_raw<2ul>(&this->writer,(char (*) [2])0x12c905);
    return;
  }
  TextWriter::write_raw<3ul>(&this->writer,(char (*) [3])"{}");
  return;
}

Assistant:

void write_items(T const& items) noexcept {
            if (items.empty()) {
                writer.write_raw("{}");
                return;
            }
            writer.write_raw("{\n");
            writer.ident_inc();
            for (auto const& item : items) {
                write_item(item);
            }
            writer.ident_dec();
            writer.pad();
            writer.write_raw("}");
        }